

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,string *a_test_case_name,string *a_name,char *a_type_param,
          char *a_value_param,CodeLocation *a_code_location,TypeId fixture_class_id,
          TestFactoryBase *factory)

{
  TestResult *this_00;
  char *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  char *in_R8;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  bool local_5b;
  allocator local_5a;
  undefined1 local_59;
  TestResult *local_58;
  byte local_4b;
  allocator local_4a;
  undefined1 local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *local_28;
  char *local_20;
  string *local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,local_18);
  local_49 = 0;
  local_4b = 0;
  if (local_20 == (char *)0x0) {
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    local_49 = 1;
    local_48 = local_a8;
    std::allocator<char>::allocator();
    local_4b = 1;
    std::__cxx11::string::string((string *)local_a8,local_20,&local_4a);
  }
  local_49 = 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 0x40),local_a8);
  if ((local_4b & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  }
  local_59 = 0;
  local_5b = local_28 == (char *)0x0;
  if (local_5b) {
    this_00 = (TestResult *)0x0;
  }
  else {
    this_00 = (TestResult *)operator_new(0x20);
    local_59 = 1;
    local_58 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this_00,local_28,&local_5a);
  }
  local_59 = 0;
  local_5b = !local_5b;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr((scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(in_RDI + 0x48),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  if (local_5b) {
    std::allocator<char>::~allocator((allocator<char> *)&local_5a);
  }
  internal::CodeLocation::CodeLocation((CodeLocation *)this_00,(CodeLocation *)(in_RDI + 0x50));
  *(undefined8 *)(in_RDI + 0x78) = in_stack_00000008;
  in_RDI[0x80] = (string)0x0;
  in_RDI[0x81] = (string)0x0;
  in_RDI[0x82] = (string)0x0;
  *(undefined8 *)(in_RDI + 0x88) = in_stack_00000010;
  TestResult::TestResult(this_00);
  return;
}

Assistant:

TestInfo::TestInfo(const std::string& a_test_case_name,
                   const std::string& a_name, const char* a_type_param,
                   const char* a_value_param,
                   internal::CodeLocation a_code_location,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : nullptr),
      value_param_(a_value_param ? new std::string(a_value_param) : nullptr),
      location_(a_code_location),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}